

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetAllDomains(Registry *this,DomainArray *aRet)

{
  PersistentStorage *pPVar1;
  int iVar2;
  Status SVar3;
  undefined1 local_40 [40];
  
  pPVar1 = this->mStorage;
  Domain::Domain((Domain *)local_40);
  iVar2 = (*pPVar1->_vptr_PersistentStorage[0x15])(pPVar1,(Domain *)local_40,aRet);
  SVar3 = kNotFound;
  if ((char)iVar2 != '\x01') {
    SVar3 = ((char)iVar2 != '\0') << 2;
  }
  std::__cxx11::string::~string((string *)(local_40 + 8));
  return SVar3;
}

Assistant:

Registry::Status Registry::GetAllDomains(DomainArray &aRet)
{
    Registry::Status status;

    status = MapStatus(mStorage->Lookup(Domain{}, aRet));

    return status;
}